

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

_Bool tlb_hit_page_anyprot
                (uc_struct_conflict15 *uc,CPUTLBEntry *tlb_entry,target_ulong_conflict page)

{
  uc_arch uVar1;
  _Bool _Var2;
  
  uVar1 = (uc_arch)tlb_entry;
  _Var2 = true;
  if (((uc->arch & 0xffffe000) != uVar1) && ((uc->mode & 0xffffe000) != uVar1)) {
    _Var2 = (uc->errnum & 0xffffe000) == uVar1;
  }
  return _Var2;
}

Assistant:

static inline bool tlb_hit_page_anyprot(struct uc_struct *uc, CPUTLBEntry *tlb_entry,
                                        target_ulong page)
{
    return tlb_hit_page(uc, tlb_entry->addr_read, page) ||
           tlb_hit_page(uc, tlb_addr_write(tlb_entry), page) ||
           tlb_hit_page(uc, tlb_entry->addr_code, page);
}